

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

pos_type __thiscall
lrit::anon_unknown_0::membuf::seekoff(membuf *this,off_type off,seekdir dir,openmode which)

{
  char *pcVar1;
  long lVar2;
  streamoff __off;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  fpos<__mbstate_t> *in_stack_ffffffffffffffb0;
  undefined1 local_10 [16];
  
  if (in_EDX == 1) {
    std::streambuf::gbump((int)in_RDI);
  }
  else if (in_EDX == 2) {
    pcVar1 = (char *)std::streambuf::eback();
    lVar2 = std::streambuf::egptr();
    std::streambuf::egptr();
    std::streambuf::setg(in_RDI,pcVar1,(char *)(lVar2 + in_RSI));
  }
  else if (in_EDX == 0) {
    in_stack_ffffffffffffffb0 = (fpos<__mbstate_t> *)std::streambuf::eback();
    lVar2 = std::streambuf::eback();
    std::streambuf::egptr();
    std::streambuf::setg(in_RDI,(char *)in_stack_ffffffffffffffb0,(char *)(lVar2 + in_RSI));
  }
  __off = std::streambuf::gptr();
  std::streambuf::eback();
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffffb0,__off);
  return (pos_type)local_10;
}

Assistant:

pos_type seekoff(
      off_type off,
      std::ios_base::seekdir dir,
      std::ios_base::openmode which = std::ios_base::in) override {
    if (dir == std::ios_base::cur) {
      gbump(off);
    } else if (dir == std::ios_base::end) {
      setg(eback(), egptr() + off, egptr());
    } else if (dir == std::ios_base::beg) {
      setg(eback(), eback() + off, egptr());
    }
    return gptr() - eback();
  }